

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_data.cc
# Opt level: O1

string * GetTestData_abi_cxx11_(string *__return_storage_ptr__,char *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  FILE *__stream;
  undefined8 extraout_RAX;
  bool bVar6;
  char *__s;
  string full_path;
  char buf [512];
  long *local_258 [2];
  long local_248 [2];
  undefined1 local_238 [520];
  
  pcVar4 = getenv("BORINGSSL_TEST_DATA_ROOT");
  __s = ".";
  if (pcVar4 != (char *)0x0) {
    __s = pcVar4;
  }
  local_258[0] = local_248;
  sVar5 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,__s,__s + sVar5);
  std::__cxx11::string::push_back((char)local_258);
  std::__cxx11::string::append((char *)local_258);
  __stream = fopen((char *)local_258[0],"rb");
  if (__stream != (FILE *)0x0) {
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    bVar6 = false;
    do {
      sVar5 = fread(local_238,1,0x200,__stream);
      if (sVar5 == 0) {
        iVar3 = feof(__stream);
        bVar6 = true;
        if (iVar3 == 0) {
          GetTestData_abi_cxx11_();
          break;
        }
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_238);
      }
      if (sVar5 == 0) {
        if ((!bVar6) &&
           (pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar2 != paVar1)) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        fclose(__stream);
        if (local_258[0] != local_248) {
          operator_delete(local_258[0],local_248[0] + 1);
        }
        return __return_storage_ptr__;
      }
    } while( true );
  }
  GetTestData_abi_cxx11_();
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::string GetTestData(const char *path) {
#if defined(BORINGSSL_USE_BAZEL_RUNFILES)
  std::string error;
  std::unique_ptr<Runfiles> runfiles(
      Runfiles::CreateForTest(BAZEL_CURRENT_REPOSITORY, &error));
  if (runfiles == nullptr) {
    fprintf(stderr, "Could not initialize runfiles: %s\n", error.c_str());
    abort();
  }

  std::string full_path = runfiles->Rlocation(std::string("boringssl/") + path);
  if (full_path.empty()) {
    fprintf(stderr, "Could not find runfile '%s'.\n", path);
    abort();
  }
#else
  const char *root = getenv("BORINGSSL_TEST_DATA_ROOT");
  root = root != nullptr ? root : ".";

  std::string full_path = root;
  full_path.push_back('/');
  full_path.append(path);
#endif

  bssl::ScopedFILE file(fopen(full_path.c_str(), "rb"));
  if (file == nullptr) {
    fprintf(stderr, "Could not open '%s'.\n", full_path.c_str());
    abort();
  }

  std::string ret;
  for (;;) {
    char buf[512];
    size_t n = fread(buf, 1, sizeof(buf), file.get());
    if (n == 0) {
      if (feof(file.get())) {
        return ret;
      }
      fprintf(stderr, "Error reading from '%s'.\n", full_path.c_str());
      abort();
    }
    ret.append(buf, n);
  }
}